

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stream.cpp
# Opt level: O0

void __thiscall dpfb::streams::FileStream::seek(FileStream *this,int64_t offset,SeekOrigin origin)

{
  int iVar1;
  int local_20;
  int whence;
  SeekOrigin origin_local;
  int64_t offset_local;
  FileStream *this_local;
  
  local_20 = 0;
  if (origin == set) {
    local_20 = 0;
  }
  else if (origin == cur) {
    local_20 = 1;
  }
  else if (origin == end) {
    local_20 = 2;
  }
  iVar1 = fseek((FILE *)this->fp,offset,local_20);
  if (iVar1 != 0) {
    throwErrno();
  }
  return;
}

Assistant:

void FileStream::seek(std::int64_t offset, SeekOrigin origin)
{
    int whence = SEEK_SET;
    switch (origin) {
        case SeekOrigin::set:
            whence = SEEK_SET;
            break;
        case SeekOrigin::cur:
            whence = SEEK_CUR;
            break;
        case SeekOrigin::end:
            whence = SEEK_END;
            break;
    }

    if (std::fseek(fp, offset, whence) != 0)
        throwErrno();
}